

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.c
# Opt level: O1

Variable * var_ht_get(VarHashTable *ht,VarHTItemKey key)

{
  size_t __n;
  uint32_t uVar1;
  int iVar2;
  VarHTItem *pVVar3;
  Variable *pVVar4;
  
  uVar1 = hash_string(key.key_ident_string,key.ident_length);
  pVVar3 = ht->buckets[ht->cap - 1 & uVar1];
  if (pVVar3 != (VarHTItem *)0x0) {
    do {
      __n = (pVVar3->key).ident_length;
      if ((__n == key.ident_length) &&
         (iVar2 = bcmp((pVVar3->key).key_ident_string,key.key_ident_string,__n), iVar2 == 0)) {
        pVVar4 = &pVVar3->value;
        goto LAB_001081c3;
      }
      pVVar3 = pVVar3->next;
    } while (pVVar3 != (var_table_item_t *)0x0);
    pVVar4 = (Variable *)0x0;
LAB_001081c3:
    if (pVVar4 != (Variable *)0x0) {
      return pVVar4;
    }
  }
  return (Variable *)0x0;
}

Assistant:

Variable *var_ht_get(VarHashTable *ht, VarHTItemKey key) {
    uint32_t index = var_hash(key) & (ht->cap - 1);

    if (ht->buckets[index] != NULL) {
        Variable *value = find(ht->buckets[index], key);
        if (value) {
            return value;
        }
    }

    return NULL;
}